

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O0

void __thiscall OpenMD::LDForceModifier::modifyForces(LDForceModifier *this)

{
  uint i_00;
  uint i_01;
  _func_int **pp_Var1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  double *pdVar9;
  reference ppMVar10;
  long in_RDI;
  int k_1;
  RealType fdot_1;
  Vector3d oldFF;
  Vector3d frictionForce;
  Vector3d velStep_1;
  Vector3d vel_1;
  Vector3d randomTorque;
  Vector3d randomForce;
  Vector3d systemForce;
  int m;
  int l;
  int linearAxis;
  int k;
  RealType tdot;
  RealType fdot;
  Vector3d frictionTorqueLab;
  Vector3d oldFTB;
  Vector3d frictionTorqueBody;
  Vector3d oldFFL;
  Vector3d frictionForceLab;
  Vector3d frictionForceBody;
  Vector3d vcdBody;
  Vector3d vcdLab;
  Vector3d omegaLab;
  Vector3d angMomStep;
  Vector3d velStep;
  Vector3d angMom;
  Vector3d vel;
  Vector3d omegaBody;
  Vector3d randomTorqueLab;
  Vector3d randomForceLab;
  Vector3d randomTorqueBody;
  Vector3d randomForceBody;
  Vector3d rcrLab;
  RealType molRad;
  Vector3d molPos;
  int fdf;
  bool freezeMolecule;
  bool doLangevinForces;
  uint index;
  Vector3d ji;
  Vector3d Tb;
  Mat3x3d Atrans;
  Mat3x3d A;
  Vector3d frc;
  Vector3d pos;
  RealType mass;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  SquareMatrix3<double> *in_stack_fffffffffffff418;
  undefined5 in_stack_fffffffffffff420;
  undefined1 in_stack_fffffffffffff425;
  undefined1 in_stack_fffffffffffff426;
  undefined1 in_stack_fffffffffffff427;
  Molecule *in_stack_fffffffffffff428;
  StuntDouble *in_stack_fffffffffffff430;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff438;
  SimInfo *in_stack_fffffffffffff440;
  HydroProp *in_stack_fffffffffffff448;
  Molecule *in_stack_fffffffffffff478;
  Vector3<double> *in_stack_fffffffffffff480;
  Vector3<double> *in_stack_fffffffffffff488;
  Velocitizer *in_stack_fffffffffffff4a0;
  StuntDouble *in_stack_fffffffffffff4a8;
  RectMatrix<double,_3U,_3U> local_a48;
  int local_9e4;
  double local_9e0;
  double local_9c0 [2];
  Velocitizer *in_stack_fffffffffffff650;
  uint in_stack_fffffffffffff65c;
  Vector3d *in_stack_fffffffffffff660;
  Vector3d *in_stack_fffffffffffff668;
  LDForceModifier *in_stack_fffffffffffff670;
  int local_544;
  double local_500;
  Vector<double,_3U> local_4f8 [3];
  double local_4b0;
  Vector<double,_3U> local_4a8 [8];
  Vector<double,_3U> local_3e8 [9];
  Vector<double,_3U> local_310 [18];
  double local_160;
  int local_13c;
  byte local_136;
  bool local_135;
  uint local_134;
  RealType local_30;
  StuntDouble *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_18);
  Vector3<double>::Vector3((Vector3<double> *)0x385de6);
  Vector3<double>::Vector3((Vector3<double> *)0x385df3);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x385e00);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x385e0d);
  Vector3<double>::Vector3((Vector3<double> *)0x385e1c);
  Vector3<double>::Vector3((Vector3<double> *)0x385e2b);
  local_134 = 0;
  local_13c = 0;
  local_20 = SimInfo::beginMolecule
                       (in_stack_fffffffffffff440,(MoleculeIterator *)in_stack_fffffffffffff438);
  do {
    if (local_20 == (Molecule *)0x0) {
      SimInfo::setFdf(*(SimInfo **)(in_RDI + 8),local_13c);
      bVar7 = Globals::getConserveLinearMomentum((Globals *)0x38734b);
      if (bVar7) {
        std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator->
                  ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
                   0x38736f);
        Velocitizer::removeComDrift(in_stack_fffffffffffff4a0);
      }
      bVar7 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x38738f);
      if ((!bVar7) && (bVar7 = Globals::getConserveAngularMomentum((Globals *)0x3873b3), bVar7)) {
        std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator->
                  ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
                   0x3873d7);
        Velocitizer::removeAngularDrift(in_stack_fffffffffffff650);
      }
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3873f0);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3873fd);
      return;
    }
    local_135 = true;
    local_136 = 0;
    if ((*(byte *)(in_RDI + 0xf8) & 1) != 0) {
      Molecule::getCom(in_stack_fffffffffffff478);
      local_160 = Vector<double,_3U>::length((Vector<double,_3U> *)0x385ece);
      local_135 = *(double *)(in_RDI + 0xe8) <= local_160 && local_160 != *(double *)(in_RDI + 0xe8)
      ;
      if (local_135) {
        local_136 = 0;
      }
      bVar7 = local_160 != *(double *)(in_RDI + 0xf0);
      bVar2 = *(double *)(in_RDI + 0xf0) <= local_160;
      if (bVar2 && bVar7) {
        local_136 = 1;
      }
      local_135 = (!bVar2 || !bVar7) && local_135;
    }
    local_28 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffff440,
                          (iterator *)in_stack_fffffffffffff438);
    while (local_28 != (StuntDouble *)0x0) {
      if ((local_136 & 1) != 0) {
        iVar8 = StuntDouble::freeze((StuntDouble *)
                                    CONCAT17(in_stack_fffffffffffff427,
                                             CONCAT16(in_stack_fffffffffffff426,
                                                      CONCAT15(in_stack_fffffffffffff425,
                                                               in_stack_fffffffffffff420))));
        local_13c = iVar8 + local_13c;
      }
      if ((local_135 & 1U) != 0) {
        local_30 = StuntDouble::getMass(local_28);
        bVar7 = StuntDouble::isDirectional
                          ((StuntDouble *)
                           CONCAT17(in_stack_fffffffffffff427,
                                    CONCAT16(in_stack_fffffffffffff426,
                                             CONCAT15(in_stack_fffffffffffff425,
                                                      in_stack_fffffffffffff420))));
        if (bVar7) {
          StuntDouble::getA((StuntDouble *)in_stack_fffffffffffff428);
          SquareMatrix3<double>::operator=
                    ((SquareMatrix3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),in_stack_fffffffffffff418);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x38608b);
          SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffff448);
          SquareMatrix3<double>::operator=
                    ((SquareMatrix3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),in_stack_fffffffffffff418);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3860c6);
          std::vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>::operator[]
                    ((vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_> *)
                     (in_RDI + 0x88),(ulong)local_134);
          OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                            (Vector<double,_3U> *)in_stack_fffffffffffff440);
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          Vector3<double>::Vector3((Vector3<double> *)0x386121);
          Vector3<double>::Vector3((Vector3<double> *)0x386130);
          genRandomForceAndTorque
                    (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                     in_stack_fffffffffffff65c);
          OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                            (Vector<double,_3U> *)in_stack_fffffffffffff440);
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                            (Vector<double,_3U> *)in_stack_fffffffffffff440);
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          StuntDouble::addFrc(in_stack_fffffffffffff430,(Vector3d *)in_stack_fffffffffffff428);
          cross<double>(in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                            (Vector<double,_3U> *)
                            CONCAT17(in_stack_fffffffffffff427,
                                     CONCAT16(in_stack_fffffffffffff426,
                                              CONCAT15(in_stack_fffffffffffff425,
                                                       in_stack_fffffffffffff420))));
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          StuntDouble::addTrq(in_stack_fffffffffffff430,(Vector3d *)in_stack_fffffffffffff428);
          Vector3<double>::Vector3((Vector3<double> *)0x386264);
          StuntDouble::getVel((StuntDouble *)in_stack_fffffffffffff428);
          StuntDouble::getJ((StuntDouble *)in_stack_fffffffffffff428);
          StuntDouble::getFrc((StuntDouble *)in_stack_fffffffffffff428);
          Vector3<double>::operator=
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector3<double> *)in_stack_fffffffffffff418);
          OpenMD::operator*((double)in_stack_fffffffffffff428,
                            (Vector<double,_3U> *)
                            CONCAT17(in_stack_fffffffffffff427,
                                     CONCAT16(in_stack_fffffffffffff426,
                                              CONCAT15(in_stack_fffffffffffff425,
                                                       in_stack_fffffffffffff420))));
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                            (Vector<double,_3U> *)
                            CONCAT17(in_stack_fffffffffffff427,
                                     CONCAT16(in_stack_fffffffffffff426,
                                              CONCAT15(in_stack_fffffffffffff425,
                                                       in_stack_fffffffffffff420))));
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          StuntDouble::getTrq((StuntDouble *)in_stack_fffffffffffff428);
          StuntDouble::lab2Body(in_stack_fffffffffffff4a8,(Vector3d *)in_stack_fffffffffffff4a0);
          Vector3<double>::operator=
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector3<double> *)in_stack_fffffffffffff418);
          OpenMD::operator*((double)in_stack_fffffffffffff428,
                            (Vector<double,_3U> *)
                            CONCAT17(in_stack_fffffffffffff427,
                                     CONCAT16(in_stack_fffffffffffff426,
                                              CONCAT15(in_stack_fffffffffffff425,
                                                       in_stack_fffffffffffff420))));
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                            (Vector<double,_3U> *)
                            CONCAT17(in_stack_fffffffffffff427,
                                     CONCAT16(in_stack_fffffffffffff426,
                                              CONCAT15(in_stack_fffffffffffff425,
                                                       in_stack_fffffffffffff420))));
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          Vector3<double>::Vector3((Vector3<double> *)0x386403);
          Vector3<double>::Vector3((Vector3<double> *)0x386412);
          Vector3<double>::Vector3((Vector3<double> *)0x386421);
          Vector3<double>::Vector3((Vector3<double> *)0x386430);
          local_4b0 = 0.0;
          Vector<double,_3U>::Vector(local_4a8,&local_4b0);
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          Vector3<double>::Vector3((Vector3<double> *)0x386479);
          local_500 = 0.0;
          Vector<double,_3U>::Vector(local_4f8,&local_500);
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          Vector3<double>::Vector3((Vector3<double> *)0x3864c2);
          Vector3<double>::Vector3((Vector3<double> *)0x3864d1);
          for (local_544 = 0; local_544 < *(int *)(in_RDI + 0xa0); local_544 = local_544 + 1) {
            bVar7 = StuntDouble::isLinear(local_28);
            if (bVar7) {
              iVar8 = StuntDouble::linearAxis(local_28);
              i_00 = iVar8 + 1 + ((iVar8 + 1) / 3) * -3;
              i_01 = iVar8 + 2 + ((iVar8 + 2) / 3) * -3;
              pdVar9 = Vector<double,_3U>::operator[](local_3e8,i_00);
              dVar3 = *pdVar9;
              ppMVar10 = std::vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>::
                         operator[]((vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                                     *)(in_RDI + 0x88),(ulong)local_134);
              pdVar9 = RectMatrix<double,_3U,_3U>::operator()
                                 ((RectMatrix<double,_3U,_3U> *)&(*ppMVar10)->Icr,i_00,i_00);
              dVar4 = *pdVar9;
              pdVar9 = Vector<double,_3U>::operator[](local_310,i_00);
              *pdVar9 = dVar3 / dVar4;
              in_stack_fffffffffffff4a8 =
                   (StuntDouble *)Vector<double,_3U>::operator[](local_3e8,i_01);
              pp_Var1 = in_stack_fffffffffffff4a8->_vptr_StuntDouble;
              ppMVar10 = std::vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>::
                         operator[]((vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                                     *)(in_RDI + 0x88),(ulong)local_134);
              in_stack_fffffffffffff4a0 =
                   (Velocitizer *)
                   RectMatrix<double,_3U,_3U>::operator()
                             ((RectMatrix<double,_3U,_3U> *)&(*ppMVar10)->Icr,i_01,i_01);
              in_stack_fffffffffffff488 =
                   (Vector3<double> *)
                   ((double)pp_Var1 /
                   ((Vector<double,_3U> *)&in_stack_fffffffffffff4a0->_vptr_Velocitizer)->data_[0]);
              pdVar9 = Vector<double,_3U>::operator[](local_310,i_01);
              *pdVar9 = (double)in_stack_fffffffffffff488;
            }
            else {
              std::vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>::operator[]
                        ((vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_> *)
                         (in_RDI + 0x88),(ulong)local_134);
              OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                                (Vector<double,_3U> *)in_stack_fffffffffffff440);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_fffffffffffff428,
                         (Vector<double,_3U> *)
                         CONCAT17(in_stack_fffffffffffff427,
                                  CONCAT16(in_stack_fffffffffffff426,
                                           CONCAT15(in_stack_fffffffffffff425,
                                                    in_stack_fffffffffffff420))));
            }
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                              (Vector<double,_3U> *)in_stack_fffffffffffff440);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            cross<double>(in_stack_fffffffffffff488,in_stack_fffffffffffff480);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                              (Vector<double,_3U> *)in_stack_fffffffffffff440);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::operator[]
                      ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)
                       (in_RDI + 0x40),(ulong)local_134);
            HydroProp::getXitt(in_stack_fffffffffffff448);
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                              (Vector<double,_3U> *)in_stack_fffffffffffff440);
            std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::operator[]
                      ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)
                       (in_RDI + 0x40),(ulong)local_134);
            HydroProp::getXirt(in_stack_fffffffffffff448);
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                              (Vector<double,_3U> *)in_stack_fffffffffffff440);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff428);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x386986);
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x386993);
            Vector3<double>::operator=
                      ((Vector3<double> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))),
                       (Vector3<double> *)in_stack_fffffffffffff418);
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                              (Vector<double,_3U> *)in_stack_fffffffffffff440);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            Vector3<double>::operator=
                      ((Vector3<double> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))),
                       (Vector3<double> *)in_stack_fffffffffffff418);
            std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::operator[]
                      ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)
                       (in_RDI + 0x40),(ulong)local_134);
            HydroProp::getXitr(in_stack_fffffffffffff448);
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                              (Vector<double,_3U> *)in_stack_fffffffffffff440);
            std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::operator[]
                      ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)
                       (in_RDI + 0x40),(ulong)local_134);
            HydroProp::getXirr(in_stack_fffffffffffff448);
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                              (Vector<double,_3U> *)in_stack_fffffffffffff440);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff428);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x386ae7);
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x386af4);
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                              (Vector<double,_3U> *)in_stack_fffffffffffff440);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            in_stack_fffffffffffff480 =
                 (Vector3<double> *)((*(double *)(in_RDI + 0xb0) / local_30) * 0.0004184);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            OpenMD::operator*((double)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            in_stack_fffffffffffff478 = (Molecule *)(*(double *)(in_RDI + 0xb0) * 0.0004184);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            OpenMD::operator*((double)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            dVar3 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff430,
                                   (Vector<double,_3U> *)in_stack_fffffffffffff428);
            dVar4 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x386c89);
            dVar5 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff430,
                                   (Vector<double,_3U> *)in_stack_fffffffffffff428);
            dVar6 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x386cd4);
            if ((ABS(1.0 - dVar3 / dVar4) <= *(double *)(in_RDI + 0xa8)) &&
               (ABS(1.0 - dVar5 / dVar6) <= *(double *)(in_RDI + 0xa8))) break;
          }
          StuntDouble::addFrc(in_stack_fffffffffffff430,(Vector3d *)in_stack_fffffffffffff428);
          cross<double>(in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                            (Vector<double,_3U> *)
                            CONCAT17(in_stack_fffffffffffff427,
                                     CONCAT16(in_stack_fffffffffffff426,
                                              CONCAT15(in_stack_fffffffffffff425,
                                                       in_stack_fffffffffffff420))));
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          StuntDouble::addTrq(in_stack_fffffffffffff430,(Vector3d *)in_stack_fffffffffffff428);
        }
        else {
          Vector3<double>::Vector3((Vector3<double> *)0x386eaf);
          Vector3<double>::Vector3((Vector3<double> *)0x386ebe);
          Vector3<double>::Vector3((Vector3<double> *)0x386ecd);
          genRandomForceAndTorque
                    (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
                     in_stack_fffffffffffff65c);
          StuntDouble::getFrc((StuntDouble *)in_stack_fffffffffffff428);
          Vector3<double>::operator=
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector3<double> *)in_stack_fffffffffffff418);
          StuntDouble::addFrc(in_stack_fffffffffffff430,(Vector3d *)in_stack_fffffffffffff428);
          StuntDouble::getVel((StuntDouble *)in_stack_fffffffffffff428);
          StuntDouble::getFrc((StuntDouble *)in_stack_fffffffffffff428);
          Vector3<double>::operator=
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector3<double> *)in_stack_fffffffffffff418);
          OpenMD::operator*((double)in_stack_fffffffffffff428,
                            (Vector<double,_3U> *)
                            CONCAT17(in_stack_fffffffffffff427,
                                     CONCAT16(in_stack_fffffffffffff426,
                                              CONCAT15(in_stack_fffffffffffff425,
                                                       in_stack_fffffffffffff420))));
          OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                            (Vector<double,_3U> *)
                            CONCAT17(in_stack_fffffffffffff427,
                                     CONCAT16(in_stack_fffffffffffff426,
                                              CONCAT15(in_stack_fffffffffffff425,
                                                       in_stack_fffffffffffff420))));
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          local_9c0[0] = 0.0;
          Vector<double,_3U>::Vector((Vector<double,_3U> *)(local_9c0 + 1),local_9c0);
          Vector3<double>::Vector3
                    ((Vector3<double> *)
                     CONCAT17(in_stack_fffffffffffff427,
                              CONCAT16(in_stack_fffffffffffff426,
                                       CONCAT15(in_stack_fffffffffffff425,in_stack_fffffffffffff420)
                                      )),(Vector<double,_3U> *)in_stack_fffffffffffff418);
          Vector3<double>::Vector3((Vector3<double> *)0x38703c);
          for (local_9e4 = 0; local_9e4 < *(int *)(in_RDI + 0xa0); local_9e4 = local_9e4 + 1) {
            Vector3<double>::operator=
                      ((Vector3<double> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))),
                       (Vector3<double> *)in_stack_fffffffffffff418);
            std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::operator[]
                      ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)
                       (in_RDI + 0x40),(ulong)local_134);
            HydroProp::getXitt(in_stack_fffffffffffff448);
            OpenMD::operator-(in_stack_fffffffffffff438);
            OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff448,
                              (Vector<double,_3U> *)in_stack_fffffffffffff440);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            RectMatrix<double,_3U,_3U>::~RectMatrix(&local_a48);
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x38710e);
            in_stack_fffffffffffff448 =
                 (HydroProp *)((*(double *)(in_RDI + 0xb0) / local_30) * 0.0004184);
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            OpenMD::operator*((double)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffff428,
                              (Vector<double,_3U> *)
                              CONCAT17(in_stack_fffffffffffff427,
                                       CONCAT16(in_stack_fffffffffffff426,
                                                CONCAT15(in_stack_fffffffffffff425,
                                                         in_stack_fffffffffffff420))));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff428,
                       (Vector<double,_3U> *)
                       CONCAT17(in_stack_fffffffffffff427,
                                CONCAT16(in_stack_fffffffffffff426,
                                         CONCAT15(in_stack_fffffffffffff425,
                                                  in_stack_fffffffffffff420))));
            in_stack_fffffffffffff440 =
                 (SimInfo *)
                 dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff430,
                                (Vector<double,_3U> *)in_stack_fffffffffffff428);
            in_stack_fffffffffffff438 =
                 (RectMatrix<double,_3U,_3U> *)
                 Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x3871d9);
            local_9e0 = (double)in_stack_fffffffffffff440 / (double)in_stack_fffffffffffff438;
            if (ABS(1.0 - local_9e0) <= *(double *)(in_RDI + 0xa8)) break;
          }
          StuntDouble::addFrc(in_stack_fffffffffffff430,(Vector3d *)in_stack_fffffffffffff428);
        }
      }
      local_134 = local_134 + 1;
      in_stack_fffffffffffff430 =
           Molecule::nextIntegrableObject
                     ((Molecule *)in_stack_fffffffffffff440,(iterator *)in_stack_fffffffffffff438);
      local_28 = in_stack_fffffffffffff430;
    }
    in_stack_fffffffffffff428 =
         SimInfo::nextMolecule
                   (in_stack_fffffffffffff440,(MoleculeIterator *)in_stack_fffffffffffff438);
    local_20 = in_stack_fffffffffffff428;
  } while( true );
}

Assistant:

void LDForceModifier::modifyForces() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    RealType mass;
    Vector3d pos;
    Vector3d frc;
    Mat3x3d A;
    Mat3x3d Atrans;
    Vector3d Tb;
    Vector3d ji;
    unsigned int index = 0;
    bool doLangevinForces;
    bool freezeMolecule;
    int fdf;

    fdf = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      doLangevinForces = true;
      freezeMolecule   = false;

      if (sphericalBoundaryConditions_) {
        Vector3d molPos = mol->getCom();
        RealType molRad = molPos.length();

        doLangevinForces = false;

        if (molRad > langevinBufferRadius_) {
          doLangevinForces = true;
          freezeMolecule   = false;
        }
        if (molRad > frozenBufferRadius_) {
          doLangevinForces = false;
          freezeMolecule   = true;
        }
      }

      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        if (freezeMolecule) fdf += sd->freeze();

        if (doLangevinForces) {
          mass = sd->getMass();
          if (sd->isDirectional()) {
            // preliminaries for directional objects:

            A      = sd->getA();
            Atrans = A.transpose();

            Vector3d rcrLab = Atrans * moments_[index]->rcr;

            // apply random force and torque at center of resistance

            Vector3d randomForceBody;
            Vector3d randomTorqueBody;
            genRandomForceAndTorque(randomForceBody, randomTorqueBody, index);
            Vector3d randomForceLab  = Atrans * randomForceBody;
            Vector3d randomTorqueLab = Atrans * randomTorqueBody;

            sd->addFrc(randomForceLab);
            sd->addTrq(randomTorqueLab + cross(rcrLab, randomForceLab));

            Vector3d omegaBody;

            // What remains contains velocity explicitly, but the
            // velocity required is at the full step: v(t + h), while
            // we have initially the velocity at the half step: v(t + h/2).
            // We need to iterate to converge the friction
            // force and friction torque vectors.

            // this is the velocity at the half-step:

            Vector3d vel    = sd->getVel();
            Vector3d angMom = sd->getJ();

            // estimate velocity at full-step using everything but
            // friction forces:

            frc = sd->getFrc();

            Vector3d velStep =
                vel + (dt2_ / mass * Constants::energyConvert) * frc;

            Tb = sd->lab2Body(sd->getTrq());
            Vector3d angMomStep =
                angMom + (dt2_ * Constants::energyConvert) * Tb;

            Vector3d omegaLab;
            Vector3d vcdLab;
            Vector3d vcdBody;
            Vector3d frictionForceBody;
            Vector3d frictionForceLab(0.0);
            Vector3d oldFFL;  // used to test for convergence
            Vector3d frictionTorqueBody(0.0);
            Vector3d oldFTB;  // used to test for convergence
            Vector3d frictionTorqueLab;
            RealType fdot;
            RealType tdot;

            // iteration starts here:

            for (int k = 0; k < maxIterNum_; k++) {
              if (sd->isLinear()) {
                int linearAxis = sd->linearAxis();
                int l          = (linearAxis + 1) % 3;
                int m          = (linearAxis + 2) % 3;
                omegaBody[l]   = angMomStep[l] / moments_[index]->Icr(l, l);
                omegaBody[m]   = angMomStep[m] / moments_[index]->Icr(m, m);

              } else {
                omegaBody = moments_[index]->IcrInv * angMomStep;
                // omegaBody[0] = angMomStep[0] /I(0, 0);
                // omegaBody[1] = angMomStep[1] /I(1, 1);
                // omegaBody[2] = angMomStep[2] /I(2, 2);
              }

              omegaLab = Atrans * omegaBody;

              // apply friction force and torque at center of resistance

              vcdLab             = velStep + cross(omegaLab, rcrLab);
              vcdBody            = A * vcdLab;
              frictionForceBody  = -(hydroProps_[index]->getXitt() * vcdBody +
                                    hydroProps_[index]->getXirt() * omegaBody);
              oldFFL             = frictionForceLab;
              frictionForceLab   = Atrans * frictionForceBody;
              oldFTB             = frictionTorqueBody;
              frictionTorqueBody = -(hydroProps_[index]->getXitr() * vcdBody +
                                     hydroProps_[index]->getXirr() * omegaBody);
              frictionTorqueLab  = Atrans * frictionTorqueBody;

              // re-estimate velocities at full-step using friction forces:

              velStep = vel + (dt2_ / mass * Constants::energyConvert) *
                                  (frc + frictionForceLab);
              angMomStep = angMom + (dt2_ * Constants::energyConvert) *
                                        (Tb + frictionTorqueBody);

              // check for convergence (if the vectors have converged, fdot and
              // tdot will both be 1.0):

              fdot = dot(frictionForceLab, oldFFL) /
                     frictionForceLab.lengthSquare();
              tdot = dot(frictionTorqueBody, oldFTB) /
                     frictionTorqueBody.lengthSquare();

              if (fabs(1.0 - fdot) <= forceTolerance_ &&
                  fabs(1.0 - tdot) <= forceTolerance_)
                break;  // iteration ends here
            }

            sd->addFrc(frictionForceLab);
            sd->addTrq(frictionTorqueLab + cross(rcrLab, frictionForceLab));

          } else {
            // spherical atom

            Vector3d systemForce;
            Vector3d randomForce;
            Vector3d randomTorque;
            genRandomForceAndTorque(randomForce, randomTorque, index);
            systemForce = sd->getFrc();
            sd->addFrc(randomForce);

            // What remains contains velocity explicitly, but the
            // velocity required is at the full step: v(t + h), while
            // we have initially the velocity at the half step: v(t + h/2).
            // We need to iterate to converge the friction
            // force vector.

            // this is the velocity at the half-step:

            Vector3d vel = sd->getVel();

            // estimate velocity at full-step using everything but
            // friction forces:

            frc = sd->getFrc();
            Vector3d velStep =
                vel + (dt2_ / mass * Constants::energyConvert) * frc;

            Vector3d frictionForce(0.0);
            Vector3d oldFF;  // used to test for convergence
            RealType fdot;

            // iteration starts here:

            for (int k = 0; k < maxIterNum_; k++) {
              oldFF         = frictionForce;
              frictionForce = -hydroProps_[index]->getXitt() * velStep;

              // re-estimate velocities at full-step using friction forces:

              velStep = vel + (dt2_ / mass * Constants::energyConvert) *
                                  (frc + frictionForce);

              // check for convergence (if the vector has converged,
              // fdot will be 1.0):

              fdot = dot(frictionForce, oldFF) / frictionForce.lengthSquare();

              if (fabs(1.0 - fdot) <= forceTolerance_)
                break;  // iteration ends here
            }

            sd->addFrc(frictionForce);
          }
        }

        ++index;
      }
    }

    info_->setFdf(fdf);
    if (simParams_->getConserveLinearMomentum()) veloMunge_->removeComDrift();
    // Remove angular drift if we are not using periodic boundary conditions.
    if (!simParams_->getUsePeriodicBoundaryConditions() &&
        simParams_->getConserveAngularMomentum())
      veloMunge_->removeAngularDrift();
  }